

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

VNode * despot::DESPOT::SelectBestWEUNode(QNode *qnode)

{
  VNode *vnode;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  VNode *pVVar3;
  double dVar4;
  double local_28;
  
  local_28 = -INFINITY;
  pmVar1 = QNode::children(qnode);
  pVVar3 = (VNode *)0x0;
  for (p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    vnode = (VNode *)p_Var2[1]._M_parent;
    dVar4 = WEU(vnode);
    if (local_28 <= dVar4) {
      pVVar3 = vnode->vstar;
      local_28 = dVar4;
    }
  }
  return pVVar3;
}

Assistant:

VNode* DESPOT::SelectBestWEUNode(QNode* qnode) {
	double weustar = Globals::NEG_INFTY;
	VNode* vstar = NULL;
	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
		it != children.end(); it++) {
		VNode* vnode = it->second;

		double weu = WEU(vnode);
		if (weu >= weustar) {
			weustar = weu;
			vstar = vnode->vstar;
		}
	}
	return vstar;
}